

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

double __thiscall NFALUT::nfa(NFALUT *this,int n,int k)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_c8;
  double local_c0;
  int local_64;
  int i;
  double p_term;
  double err;
  double bin_tail;
  double mult_term;
  double bin_term;
  double term;
  double log1term;
  double tolerance;
  int k_local;
  int n_local;
  NFALUT *this_local;
  
  if ((((n < 0) || (k < 0)) || (n < k)) || ((this->prob <= 0.0 || (1.0 <= this->prob)))) {
    this_local = (NFALUT *)0xbff0000000000000;
  }
  else if ((n == 0) || (k == 0)) {
    this_local = (NFALUT *)((ulong)this->logNT ^ 0x8000000000000000);
  }
  else if (n == k) {
    dVar8 = this->logNT;
    dVar2 = log10(this->prob);
    this_local = (NFALUT *)(-(double)n * dVar2 + -dVar8);
  }
  else {
    dVar8 = this->prob;
    dVar2 = this->prob;
    dVar3 = log_gamma((double)n + 1.0);
    dVar4 = log_gamma((double)k + 1.0);
    dVar5 = log_gamma((double)(n - k) + 1.0);
    dVar6 = log(this->prob);
    dVar7 = log(1.0 - this->prob);
    dVar3 = (double)(n - k) * dVar7 + (double)k * dVar6 + ((dVar3 - dVar4) - dVar5);
    err = exp(dVar3);
    iVar1 = double_equal(err,0.0);
    if (iVar1 == 0) {
      bin_term = err;
      for (local_64 = k + 1; local_64 <= n; local_64 = local_64 + 1) {
        if (local_64 < 100000) {
          if ((nfa::inv[local_64] != 0.0) || (NAN(nfa::inv[local_64]))) {
            local_c0 = nfa::inv[local_64];
          }
          else {
            local_c0 = 1.0 / (double)local_64;
            nfa::inv[local_64] = local_c0;
          }
          local_c8 = local_c0;
        }
        else {
          local_c8 = 1.0 / (double)local_64;
        }
        local_c8 = (double)((n - local_64) + 1) * local_c8;
        dVar3 = local_c8 * (dVar8 / (1.0 - dVar2));
        bin_term = dVar3 * bin_term;
        err = bin_term + err;
        if (local_c8 < 1.0) {
          dVar4 = pow(dVar3,(double)((n - local_64) + 1));
          dVar5 = log10(err);
          if (bin_term * ((1.0 - dVar4) / (1.0 - dVar3) - 1.0) <
              (double)((ulong)(-dVar5 - this->logNT) & (ulong)DAT_00133380) * 0.1 * err) break;
        }
      }
      dVar8 = log10(err);
      this_local = (NFALUT *)(-dVar8 - this->logNT);
    }
    else if ((double)k <= (double)n * this->prob) {
      this_local = (NFALUT *)((ulong)this->logNT ^ 0x8000000000000000);
    }
    else {
      this_local = (NFALUT *)(-dVar3 / 2.302585092994046 - this->logNT);
    }
  }
  return (double)this_local;
}

Assistant:

double NFALUT::nfa(int n, int k)
{
	static double inv[TABSIZE];   /* table to keep computed inverse values */
	double tolerance = 0.1;       /* an error of 10% in the result is accepted */
	double log1term, term, bin_term, mult_term, bin_tail, err, p_term;
	int i;

	/* check parameters */
	if (n<0 || k<0 || k>n || prob <= 0.0 || prob >= 1.0) return -1.0;

	/* trivial cases */
	if (n == 0 || k == 0) return -logNT;
	if (n == k) return -logNT - (double)n * log10(prob);

	/* probability term */
	p_term = prob / (1.0 - prob);

	/* compute the first term of the series */
	/*
	binomial_tail(n,k,p) = sum_{i=k}^n bincoef(n,i) * p^i * (1-p)^{n-i}
	where bincoef(n,i) are the binomial coefficients.
	But
	bincoef(n,k) = gamma(n+1) / ( gamma(k+1) * gamma(n-k+1) ).
	We use this to compute the first term. Actually the log of it.
	*/
	log1term = log_gamma((double)n + 1.0) - log_gamma((double)k + 1.0)
		- log_gamma((double)(n - k) + 1.0)
		+ (double)k * log(prob) + (double)(n - k) * log(1.0 - prob);
	term = exp(log1term);

	/* in some cases no more computations are needed */
	if (double_equal(term, 0.0)) {              /* the first term is almost zero */
		if ((double)k > (double)n * prob)     /* at begin or end of the tail?  */
			return -log1term / M_LN10 - logNT;  /* end: use just the first term  */
		else
			return -logNT;                      /* begin: the tail is roughly 1  */
	} //end-if

	  /* compute more terms if needed */
	bin_tail = term;
	for (i = k + 1; i <= n; i++) {
		/*
		As
		term_i = bincoef(n,i) * p^i * (1-p)^(n-i)
		and
		bincoef(n,i)/bincoef(n,i-1) = n-1+1 / i,
		then,
		term_i / term_i-1 = (n-i+1)/i * p/(1-p)
		and
		term_i = term_i-1 * (n-i+1)/i * p/(1-p).
		1/i is stored in a table as they are computed,
		because divisions are expensive.
		p/(1-p) is computed only once and stored in 'p_term'.
		*/
		bin_term = (double)(n - i + 1) * (i<TABSIZE ?
			(inv[i] != 0.0 ? inv[i] : (inv[i] = 1.0 / (double)i)) :
			1.0 / (double)i);

		mult_term = bin_term * p_term;
		term *= mult_term;
		bin_tail += term;

		if (bin_term<1.0) {
			/* When bin_term<1 then mult_term_j<mult_term_i for j>i.
			Then, the error on the binomial tail when truncated at
			the i term can be bounded by a geometric series of form
			term_i * sum mult_term_i^j.                            */
			err = term * ((1.0 - pow(mult_term, (double)(n - i + 1))) /
				(1.0 - mult_term) - 1.0);

			/* One wants an error at most of tolerance*final_result, or:
			tolerance * abs(-log10(bin_tail)-logNT).
			Now, the error that can be accepted on bin_tail is
			given by tolerance*final_result divided by the derivative
			of -log10(x) when x=bin_tail. that is:
			tolerance * abs(-log10(bin_tail)-logNT) / (1/bin_tail)
			Finally, we truncate the tail if the error is less than:
			tolerance * abs(-log10(bin_tail)-logNT) * bin_tail        */
			if (err < tolerance * fabs(-log10(bin_tail) - logNT) * bin_tail) break;
		} //end-if
	} //end-for

	return -log10(bin_tail) - logNT;
}